

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

RepeatedField<bool> *
google::protobuf::Arena::InternalHelper<google::protobuf::RepeatedField<bool>>::
Construct<google::protobuf::Arena*>(void *ptr,Arena **args)

{
  Arena **args_local;
  void *ptr_local;
  
  RepeatedField<bool>::RepeatedField((RepeatedField<bool> *)ptr,*args);
  return (RepeatedField<bool> *)ptr;
}

Assistant:

static T* PROTOBUF_NONNULL Construct(void* PROTOBUF_NONNULL ptr,
                                         Args&&... args) {
      return new (ptr) T(static_cast<Args&&>(args)...);
    }